

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_date.cpp
# Opt level: O0

string * __thiscall
pstore::http::http_date_abi_cxx11_(string *__return_storage_ptr__,http *this,time_t time)

{
  char *pcVar1;
  char *pcVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  size_type sVar5;
  size_t sVar6;
  const_reference ppcVar7;
  const_reference ppcVar8;
  ostream *poVar9;
  ostringstream local_1d8 [8];
  ostringstream fixdate;
  value_type month;
  value_type day_name;
  tm t;
  time_t time_local;
  
  t.tm_zone = (char *)this;
  gm_time((tm *)&day_name,(time_t)this);
  sVar5 = std::array<const_char_*,_7UL>::size(&http_date::days);
  sVar6 = (anonymous_namespace)::as_index<int,void>(t.tm_mon,sVar5);
  ppcVar7 = std::array<const_char_*,_7UL>::operator[](&http_date::days,sVar6);
  pcVar1 = *ppcVar7;
  sVar5 = std::array<const_char_*,_12UL>::size(&http_date::months);
  sVar6 = (anonymous_namespace)::as_index<int,void>(t.tm_hour,sVar5);
  ppcVar8 = std::array<const_char_*,_12UL>::operator[](&http_date::months,sVar6);
  pcVar2 = *ppcVar8;
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  _Var3 = std::setfill<char>('0');
  poVar9 = std::operator<<(local_1d8,_Var3._M_c);
  poVar9 = std::operator<<(poVar9,pcVar1);
  poVar9 = std::operator<<(poVar9,", ");
  _Var4 = std::setw(2);
  poVar9 = std::operator<<(poVar9,_Var4);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,t.tm_min);
  poVar9 = std::operator<<(poVar9,' ');
  poVar9 = std::operator<<(poVar9,pcVar2);
  poVar9 = std::operator<<(poVar9,' ');
  _Var4 = std::setw(4);
  poVar9 = std::operator<<(poVar9,_Var4);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,t.tm_mday + 0x76c);
  poVar9 = std::operator<<(poVar9,' ');
  _Var4 = std::setw(2);
  poVar9 = std::operator<<(poVar9,_Var4);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,t.tm_sec);
  poVar9 = std::operator<<(poVar9,':');
  _Var4 = std::setw(2);
  poVar9 = std::operator<<(poVar9,_Var4);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,day_name._4_4_);
  poVar9 = std::operator<<(poVar9,':');
  _Var4 = std::setw(2);
  poVar9 = std::operator<<(poVar9,_Var4);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)day_name);
  std::operator<<(poVar9," GMT");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  return __return_storage_ptr__;
}

Assistant:

std::string http_date (time_t const time) {
            std::tm const t = gm_time (time);

            // day-name = %x4D.6F.6E ; "Mon", case-sensitive
            //          / %x54.75.65 ; "Tue", case-sensitive
            //          / %x57.65.64 ; "Wed", case-sensitive
            //          / %x54.68.75 ; "Thu", case-sensitive
            //          / %x46.72.69 ; "Fri", case-sensitive
            //          / %x53.61.74 ; "Sat", case-sensitive
            //          / %x53.75.6E ; "Sun", case-sensitive
            static constexpr std::array<char const *, 7> days{
                {"Sun", "Mon", "Tue", "Wed", "Thu", "Fri", "Sat"}};
            auto const day_name = days[as_index (t.tm_wday, days.size ())];

            // month = %x4A.61.6E ; "Jan", case-sensitive
            //       / %x46.65.62 ; "Feb", case-sensitive
            //       / %x4D.61.72 ; "Mar", case-sensitive
            //       / %x41.70.72 ; "Apr", case-sensitive
            //       / %x4D.61.79 ; "May", case-sensitive
            //       / %x4A.75.6E ; "Jun", case-sensitive
            //       / %x4A.75.6C ; "Jul", case-sensitive
            //       / %x41.75.67 ; "Aug", case-sensitive
            //       / %x53.65.70 ; "Sep", case-sensitive
            //       / %x4F.63.74 ; "Oct", case-sensitive
            //       / %x4E.6F.76 ; "Nov", case-sensitive
            //       / %x44.65.63 ; "Dec", case-sensitive
            static constexpr std::array<char const *, 12> months{{"Jan", "Feb", "Mar", "Apr", "May",
                                                                  "Jun", "Jul", "Aug", "Sep", "Oct",
                                                                  "Nov", "Dec"}};
            auto const month = months[as_index (t.tm_mon, months.size ())];

            // hour         = 2DIGIT
            // minute       = 2DIGIT
            // second       = 2DIGIT
            // time-of-day  = hour ":" minute ":" second
            //              ; 00:00:00 - 23:59:60 (leap second)
            // year         = 4DIGIT
            // day          = 2DIGIT
            // date1        = day SP month SP year
            //              ; e.g., 02 Jun 1982
            // IMF-fixdate  = day-name "," SP date1 SP time-of-day SP GMT
            std::ostringstream fixdate;
            fixdate << std::setfill ('0') << day_name << ", " << std::setw (2) << t.tm_mday << ' '
                    << month << ' ' << std::setw (4) << t.tm_year + 1900 << ' ' << std::setw (2)
                    << t.tm_hour << ':' << std::setw (2) << t.tm_min << ':' << std::setw (2)
                    << t.tm_sec << " GMT";
            return fixdate.str ();
        }